

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O1

bool cmFunctionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> __s;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_50;
  long *local_48 [2];
  long local_38 [2];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  else {
    __s.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         operator_new(0xb0);
    memset((void *)__s.
                   super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                   .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl,0,0xb0);
    *(long **)((long)__s.
                     super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                     .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8) =
         (long *)((long)__s.
                        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                        .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18);
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined1 *)
     ((long)__s.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18) = 0;
    *(long **)((long)__s.
                     super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                     .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x28) =
         (long *)((long)__s.
                        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                        .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38);
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x30) = 0;
    *(undefined1 *)
     ((long)__s.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38) = 0;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x48) = 0;
    *(undefined1 *)
     ((long)__s.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x70) = 0;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x78) = 0;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x80) = 0;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x88) = 0;
    *(undefined4 *)
     ((long)__s.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x90) = 1;
    *(undefined ***)
     __s.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
     super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         &PTR__cmFunctionFunctionBlocker_008ccf68;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98) = 0;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0) = 0;
    *(long *)((long)__s.
                    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                    .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               ((long)__s.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98),
               *(long *)((long)__s.
                               super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                               .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl +
                        0xa0),pbVar1,pbVar2);
    local_50._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         __s.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
         super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
    cmMakefile::AddFunctionBlocker
              (status->Makefile,
               (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&local_50);
    if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
        local_50._M_t.
        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
        super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0)
    {
      (**(code **)(*(long *)local_50._M_t.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))();
    }
  }
  return pbVar1 != pbVar2;
}

Assistant:

bool cmFunctionCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // create a function blocker
  auto fb = cm::make_unique<cmFunctionFunctionBlocker>();
  cm::append(fb->Args, args);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}